

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void sc_context_state(sc_state_t *state,sc_context_sp_t ctx)

{
  uint64_t unaff_RBX;
  uint64_t unaff_RBP;
  uint64_t unaff_R12;
  uint64_t unaff_R13;
  uint64_t unaff_R14;
  uint64_t unaff_R15;
  
  state->type = SC_CPU_TYPE_X64;
  if (ctx != (sc_context_sp_t)0x0) {
    (state->registers).arm64.x19 = *ctx;
    (state->registers).arm64.x20 = *(uint64_t *)((long)ctx + 8);
    (state->registers).arm64.x21 = *(uint64_t *)((long)ctx + 0x10);
    (state->registers).arm64.x22 = *(uint64_t *)((long)ctx + 0x18);
    (state->registers).arm64.x23 = 0;
    (state->registers).arm64.x24 = 0;
    (state->registers).arm64.x25 = *(uint64_t *)((long)ctx + 0x20);
    (state->registers).arm64.x26 = *(uint64_t *)((long)ctx + 0x28);
    (state->registers).arm64.x27 = *(uint64_t *)((long)ctx + 0x30);
    (state->registers).arm64.x28 = (long)ctx + 0x38;
    return;
  }
  (state->registers).arm64.x19 = unaff_R12;
  (state->registers).arm64.x20 = unaff_R13;
  (state->registers).arm64.x21 = unaff_R14;
  (state->registers).arm64.x22 = unaff_R15;
  (state->registers).arm64.x23 = (uint64_t)&state->registers;
  (state->registers).arm64.x24 = 0;
  (state->registers).arm64.x25 = unaff_RBX;
  (state->registers).arm64.x26 = unaff_RBP;
  (state->registers).arm64.x27 = 0x155f61;
  (state->registers).arm64.x28 = (uint64_t)register0x00000020;
  return;
}

Assistant:

void SC_CALL_DECL sc_context_state (sc_state_t* state, sc_context_sp_t ctx) {
    state->type = SC_CPU_TYPE_X64;

    if (ctx) {
        // Windows has a bunch of data before the registers we're looking for.
#   if defined(_WIN64)
        uint64_t* stack = (uint64_t*)ctx + 25;
#   else
        uint64_t* stack = (uint64_t*)ctx;
#   endif

        state->registers.x64.r12 = *stack++;
        state->registers.x64.r13 = *stack++;
        state->registers.x64.r14 = *stack++;
        state->registers.x64.r15 = *stack++;

        // RDI and RSI are only stored for Windows
#   if defined(_WIN64)
        state->registers.x64.rdi = *stack++;
        state->registers.x64.rsi = *stack++;
#   else
        state->registers.x64.rdi = 0;
        state->registers.x64.rsi = 0;
#   endif

        state->registers.x64.rbx = *stack++;
        state->registers.x64.rbp = *stack++;
        state->registers.x64.rip = *stack++;
        state->registers.x64.rsp = (uint64_t)stack;
    } else {
#   if defined(_MSC_VER)
        CONTEXT regs;
        regs.ContextFlags = CONTEXT_INTEGER | CONTEXT_CONTROL;

        GetThreadContext(GetCurrentThread(), &regs);

        state->registers.x64.r12 = regs.R12;
        state->registers.x64.r13 = regs.R13;
        state->registers.x64.r14 = regs.R14;
        state->registers.x64.r15 = regs.R15;
        state->registers.x64.rdi = regs.Rdi;
        state->registers.x64.rsi = regs.Rsi;
        state->registers.x64.rbx = regs.Rbx;
        state->registers.x64.rbp = regs.Rbp;
        state->registers.x64.rip = regs.Rip;
        state->registers.x64.rsp = regs.Rsp;
#   else
        void* x64 = &state->registers.x64;
        asm (
            "leaq   (%%rip), %%r8 \n"
            "movq   %%r12, 0x00(%0) \n"
            "movq   %%r13, 0x08(%0) \n"
            "movq   %%r14, 0x10(%0) \n"
            "movq   %%r15, 0x18(%0) \n"
            "movq   %%rdi, 0x20(%0) \n"
            "movq   %%rsi, 0x28(%0) \n"
            "movq   %%rbx, 0x30(%0) \n"
            "movq   %%rbp, 0x38(%0) \n"
            "movq   %%r8, 0x40(%0) \n"
            "movq   %%rsp, 0x48(%0) \n"
            :
            : "r" (x64)
            : "r8"
        );
#   endif
    }
}